

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int PaletteSort(PaletteSorting method,WebPPicture *pic,uint32_t *palette_sorted,uint32_t num_colors,
               uint32_t *palette)

{
  int *piVar1;
  uint32_t uVar2;
  uint uVar3;
  void *pvVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  void *ptr;
  void *ptr_00;
  uint32_t *puVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  uint32_t *puVar18;
  uint32_t best_score;
  int iVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  uint *puVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  void *pvVar31;
  uint32_t *puVar32;
  bool bVar33;
  void *local_c70;
  undefined4 local_c38;
  uint32_t idx_map [256];
  
  uVar26 = (ulong)num_colors;
  uVar20 = (ulong)num_colors;
  if (method == kModifiedZeng) {
    if (num_colors < 2) {
      return 1;
    }
    ptr = WebPSafeCalloc((ulong)(num_colors * num_colors),4);
    if (ptr != (void *)0x0) {
      puVar25 = pic->argb;
      uVar10 = *puVar25;
      iVar28 = 0;
      memset(idx_map,0,0x400);
      ptr_00 = WebPSafeMalloc((long)pic->width * 2,4);
      if (ptr_00 != (void *)0x0) {
        uVar7 = ~uVar10;
        iVar6 = pic->width;
        PrepareMapToPalette(palette_sorted,num_colors,&local_c38,idx_map);
        uVar5 = 0;
        pvVar4 = (void *)((long)ptr_00 + (long)iVar6 * 4);
        local_c70 = ptr_00;
        for (; pvVar31 = pvVar4, iVar28 < pic->height; iVar28 = iVar28 + 1) {
          for (lVar21 = 0; lVar21 < pic->width; lVar21 = lVar21 + 1) {
            uVar2 = puVar25[lVar21];
            if (uVar2 != uVar7) {
              iVar6 = SearchColorNoIdx(&local_c38,uVar2,num_colors);
              uVar5 = idx_map[iVar6];
              uVar7 = uVar2;
            }
            *(uint32_t *)((long)pvVar31 + lVar21 * 4) = uVar5;
            if ((lVar21 != 0) &&
               (uVar2 = *(uint32_t *)((long)pvVar31 + lVar21 * 4 + -4), uVar5 != uVar2)) {
              piVar1 = (int *)((long)ptr + (ulong)(uVar5 * num_colors + uVar2) * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)ptr + (ulong)(uVar2 * num_colors + uVar5) * 4);
              *piVar1 = *piVar1 + 1;
            }
            if ((iVar28 != 0) &&
               (uVar2 = *(uint32_t *)((long)local_c70 + lVar21 * 4), uVar5 != uVar2)) {
              piVar1 = (int *)((long)ptr + (ulong)(uVar5 * num_colors + uVar2) * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)ptr + (ulong)(uVar2 * num_colors + uVar5) * 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          puVar25 = puVar25 + pic->argb_stride;
          pvVar4 = local_c70;
          local_c70 = pvVar31;
        }
        WebPSafeFree(ptr_00);
        uVar14 = 0;
        uVar26 = 0;
        uVar10 = 0;
        uVar11 = 0;
        puVar32 = idx_map;
        while( true ) {
          uVar30 = uVar26 & 0xff;
          if (uVar11 == num_colors) break;
          uVar13 = 0;
          uVar26 = uVar20;
          uVar12 = uVar14;
          while( true ) {
            bVar33 = uVar26 == 0;
            uVar26 = uVar26 - 1;
            if (bVar33) break;
            uVar13 = uVar13 + *(int *)((long)ptr + (ulong)uVar12 * 4);
            uVar12 = uVar12 + 1;
          }
          uVar12 = (uint)uVar30;
          if (uVar10 < uVar13) {
            uVar10 = uVar13;
            uVar12 = uVar11;
          }
          uVar11 = uVar11 + 1;
          uVar14 = uVar14 + num_colors;
          uVar26 = (ulong)uVar12;
        }
        local_c38._0_1_ = (char)uVar26;
        uVar23 = 0;
        uVar24 = 0;
        uVar10 = 0;
        while( true ) {
          uVar15 = uVar24 & 0xff;
          if (uVar20 == uVar23) break;
          uVar14 = *(uint *)((long)ptr + (ulong)((uint)uVar30 * num_colors + (uint)uVar23) * 4);
          uVar11 = (uint)uVar15;
          if (uVar10 < uVar14) {
            uVar10 = uVar14;
            uVar11 = (uint)uVar23;
          }
          uVar23 = uVar23 + 1;
          uVar24 = (ulong)uVar11;
        }
        local_c38._1_1_ = (char)uVar24;
        if (num_colors - 2 == 0) {
          uVar10 = 0;
        }
        else {
          idx_map[0]._0_1_ = 0;
          idx_map[1] = 0;
          uVar10 = 0;
          uVar23 = uVar15;
          for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
            if (((uVar26 & 0xff) != uVar24) && (uVar15 != uVar24)) {
              uVar27 = (ulong)uVar10;
              *(char *)(idx_map + uVar27 * 2) = (char)uVar24;
              uVar14 = *(int *)((long)ptr + uVar23 * 4) + *(int *)((long)ptr + uVar30 * 4);
              idx_map[uVar27 * 2 + 1] = uVar14;
              if (puVar32[1] < uVar14) {
                puVar32 = idx_map + uVar27 * 2;
              }
              uVar10 = uVar10 + 1;
            }
            uVar23 = (ulong)((int)uVar23 + num_colors);
            uVar30 = (ulong)((int)uVar30 + num_colors);
          }
          uVar26 = (ulong)(num_colors - 2);
          uVar11 = num_colors - 3;
          uVar10 = 0;
          iVar28 = 1;
          uVar14 = 1;
          while (bVar33 = uVar26 != 0, uVar26 = uVar26 - 1, bVar33) {
            uVar30 = (ulong)uVar11;
            uVar13 = uVar14 + 1;
            iVar19 = (byte)*puVar32 * num_colors;
            iVar29 = 0;
            iVar6 = iVar28;
            for (uVar12 = uVar10; (uint)((ulong)uVar12 % (ulong)num_colors) != uVar13;
                uVar12 = uVar12 + 1) {
              iVar29 = iVar29 + *(int *)((long)ptr +
                                        (ulong)((uint)*(byte *)((long)&local_c38 +
                                                               (ulong)uVar12 % (ulong)num_colors) +
                                               iVar19) * 4) * iVar6;
              iVar6 = iVar6 + -2;
            }
            uVar12 = uVar10;
            if (uVar10 == 0) {
              uVar12 = num_colors;
            }
            uVar3 = uVar13;
            if (0 < iVar29) {
              uVar3 = uVar12 - 1;
            }
            if (0 < iVar29) {
              uVar10 = uVar12 - 1;
            }
            *(byte *)((long)&local_c38 + (ulong)uVar3) = (byte)*puVar32;
            *(undefined8 *)puVar32 = *(undefined8 *)(idx_map + (uVar26 & 0xffffffff) * 2);
            puVar8 = idx_map;
            puVar32 = puVar8;
            while (bVar33 = uVar30 != 0, uVar30 = uVar30 - 1, bVar33) {
              uVar12 = puVar8[1] + *(int *)((long)ptr + (ulong)((uint)(byte)*puVar8 + iVar19) * 4);
              puVar8[1] = uVar12;
              puVar18 = puVar8;
              if (uVar12 <= puVar32[1]) {
                puVar18 = puVar32;
              }
              puVar8 = puVar8 + 2;
              puVar32 = puVar18;
            }
            if (iVar29 < 1) {
              uVar14 = uVar13;
            }
            uVar11 = uVar11 - 1;
            iVar28 = iVar28 + 1;
          }
        }
        WebPSafeFree(ptr);
        for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
          palette[uVar26] =
               palette_sorted
               [*(byte *)((long)&local_c38 + (ulong)(uVar10 + (int)uVar26) % (ulong)num_colors)];
        }
        goto LAB_00162e5b;
      }
      WebPSafeFree(ptr);
    }
    iVar28 = 0;
  }
  else {
    if (method != kMinimizeDelta) {
      if (method != kSortedDefault) {
        return 0;
      }
      if ((num_colors < 0x12) || (*palette_sorted != 0)) {
        memcpy(palette,palette_sorted,uVar20 << 2);
      }
      else {
        memcpy(palette,palette_sorted + 1,(ulong)(num_colors - 1) * 4);
        palette[num_colors - 1] = 0;
      }
      return 1;
    }
    memcpy(palette,palette_sorted,(long)(int)num_colors << 2);
    uVar20 = 0;
    local_c70 = (void *)0x0;
    if (0 < (int)num_colors) {
      local_c70 = (void *)(ulong)num_colors;
    }
    bVar17 = 0;
    uVar5 = 0;
    for (; local_c70 != (void *)uVar20; uVar20 = uVar20 + 1) {
      uVar7 = palette_sorted[uVar20];
      uVar5 = VP8LSubPixels(uVar7,uVar5);
      uVar10 = uVar5 >> 0x10 & 0xff;
      bVar22 = 2 - (uVar10 < 0x80);
      if (uVar10 == 0) {
        bVar22 = (byte)(uVar5 >> 0x10);
      }
      uVar10 = uVar5 >> 8 & 0xff;
      bVar9 = (0x7f < uVar10) * '\b' + 8;
      if (uVar10 == 0) {
        bVar9 = (byte)(uVar5 >> 8);
      }
      bVar16 = 0x80;
      if ((uVar5 & 0xff) < 0x80) {
        bVar16 = 0x40;
      }
      if ((uVar5 & 0xff) == 0) {
        bVar16 = (byte)uVar5;
      }
      bVar17 = bVar16 | bVar22 | bVar9 | bVar17;
      uVar5 = uVar7;
    }
    if ((bVar17 * '\x02' & bVar17) != 0) {
      if ((0x11 < (int)num_colors) && (*palette == 0)) {
        uVar26 = (ulong)(num_colors - 1);
        uVar5 = palette[uVar26];
        palette[uVar26] = 0;
        *palette = uVar5;
        local_c70 = (void *)uVar26;
      }
      uVar5 = 0;
      for (uVar20 = 0; (void *)uVar20 != local_c70; uVar20 = uVar20 + 1) {
        uVar23 = uVar20 & 0xffffffff;
        uVar10 = 0xffffffff;
        for (uVar30 = uVar20; uVar26 != uVar30; uVar30 = uVar30 + 1) {
          uVar7 = VP8LSubPixels(palette[uVar30],uVar5);
          uVar11 = uVar7 & 0xff;
          uVar14 = 0x100 - uVar11;
          if (uVar11 < 0x81) {
            uVar14 = uVar11;
          }
          uVar12 = uVar7 >> 8 & 0xff;
          uVar11 = 0x100 - uVar12;
          if (uVar12 < 0x81) {
            uVar11 = uVar12;
          }
          uVar13 = uVar7 >> 0x10 & 0xff;
          uVar12 = 0x100 - uVar13;
          if (uVar13 < 0x81) {
            uVar12 = uVar13;
          }
          uVar13 = 0x100 - (uVar7 >> 0x18);
          if (uVar7 < 0x81000000) {
            uVar13 = uVar7 >> 0x18;
          }
          uVar13 = uVar13 + (uVar12 + uVar11 + uVar14) * 9;
          if (uVar13 < uVar10) {
            uVar23 = uVar30 & 0xffffffff;
          }
          if (uVar13 <= uVar10) {
            uVar10 = uVar13;
          }
        }
        uVar5 = palette[(int)uVar23];
        palette[(int)uVar23] = palette[uVar20];
        palette[uVar20] = uVar5;
      }
    }
LAB_00162e5b:
    iVar28 = 1;
  }
  return iVar28;
}

Assistant:

int PaletteSort(PaletteSorting method, const struct WebPPicture* const pic,
                const uint32_t* const palette_sorted, uint32_t num_colors,
                uint32_t* const palette) {
  switch (method) {
    case kSortedDefault:
      if (palette_sorted[0] == 0 && num_colors > 17) {
        memcpy(palette, palette_sorted + 1,
               (num_colors - 1) * sizeof(*palette_sorted));
        palette[num_colors - 1] = 0;
      } else {
        memcpy(palette, palette_sorted, num_colors * sizeof(*palette));
      }
      return 1;
    case kMinimizeDelta:
      PaletteSortMinimizeDeltas(palette_sorted, num_colors, palette);
      return 1;
    case kModifiedZeng:
      return PaletteSortModifiedZeng(pic, palette_sorted, num_colors, palette);
    case kUnusedPalette:
    case kPaletteSortingNum:
      break;
  }

  assert(0);
  return 0;
}